

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void EDLines::SplitSegment2Lines
               (double *x,double *y,int noPixels,int segmentNo,
               vector<LineSegment,_std::allocator<LineSegment>_> *lines,int min_line_len,
               double line_error)

{
  pointer *ppLVar1;
  double y1;
  int invert;
  int iVar2;
  int iVar3;
  long lVar4;
  LineSegment *pLVar5;
  iterator __position;
  int iVar6;
  int count;
  int iVar7;
  long lVar8;
  byte bVar9;
  double dVar10;
  double dVar11;
  double a;
  double b;
  int lastInvert;
  double lastB;
  double lastA;
  double error;
  double local_100;
  double local_f8;
  int local_d4;
  long local_d0;
  ulong local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  int local_a8;
  int local_a4;
  long local_a0;
  vector<LineSegment,_std::allocator<LineSegment>_> *local_98;
  double local_90;
  double local_88;
  double local_80;
  LineSegment local_78;
  
  bVar9 = 0;
  if (min_line_len <= noPixels) {
    iVar2 = 0;
    local_c0 = line_error;
    local_a4 = segmentNo;
    local_98 = lines;
    do {
      lVar8 = (long)noPixels;
      iVar3 = noPixels + 1;
      local_c8 = (ulong)(1 - iVar2);
      iVar2 = -iVar2;
      while (LineFit(x,y,min_line_len,&local_b0,&local_b8,&local_80,&local_d4), invert = local_d4,
            lVar4 = lVar8, iVar7 = min_line_len, count = min_line_len, 0.5 < local_80) {
        x = x + 1;
        y = y + 1;
        lVar8 = lVar8 + -1;
        iVar3 = iVar3 + -1;
        iVar2 = iVar2 + -1;
        local_c8 = local_c8 - 1;
        if (iVar3 <= min_line_len) {
          return;
        }
      }
      do {
        local_a8 = iVar7;
        local_d0 = lVar4;
        a = local_b0;
        b = local_b8;
        iVar3 = (int)lVar8;
        if (iVar3 <= min_line_len) goto LAB_00118f87;
        iVar6 = min_line_len + -1;
        lVar4 = (long)min_line_len;
        iVar7 = 0;
        iVar3 = 0;
        do {
          dVar10 = ComputeMinDistance(x[lVar4],y[lVar4],a,b,invert);
          lVar8 = local_d0;
          if (dVar10 <= local_c0) {
            iVar3 = iVar3 + 1;
            iVar7 = 0;
            iVar6 = (int)lVar4;
          }
          else {
            if (3 < iVar7) break;
            iVar7 = iVar7 + 1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < local_d0);
        if (iVar3 < 2) break;
        count = (count - min_line_len) + iVar6 + 1;
        LineFit(x,y,count,&local_b0,&local_b8,invert);
        min_line_len = iVar6 + 1;
        a = local_b0;
        b = local_b8;
        lVar4 = local_d0;
        iVar7 = local_a8;
      } while (min_line_len < (int)lVar8);
      lVar8 = 0;
      do {
        lVar4 = lVar8;
        dVar10 = x[lVar4];
        y1 = y[lVar4];
        dVar11 = ComputeMinDistance(dVar10,y1,a,b,invert);
        lVar8 = lVar4 + 1;
      } while (local_c0 < dVar11);
      if (invert == 0) {
        if ((b != 0.0) || (local_100 = a, local_f8 = dVar10, NAN(b))) {
          local_f8 = (a - (y1 - dVar10 * (-1.0 / b))) / (-1.0 / b - b);
          local_100 = b * local_f8 + a;
        }
      }
      else if ((b != 0.0) || (local_100 = y1, local_f8 = a, NAN(b))) {
        local_100 = (a - (dVar10 - y1 * (-1.0 / b))) / (-1.0 / b - b);
        local_f8 = b * local_100 + a;
      }
      lVar8 = (long)iVar6;
      count = iVar6 + 2;
      iVar7 = count - (int)lVar4;
      local_a0 = lVar4 + 1;
      do {
        local_88 = x[lVar8];
        local_90 = y[lVar8];
        dVar10 = ComputeMinDistance(local_88,local_90,a,b,invert);
        lVar8 = lVar8 + -1;
        iVar7 = iVar7 + -1;
        count = count + -1;
      } while (local_c0 < dVar10);
      if (invert == 0) {
        if ((b != 0.0) || (local_78.ey = a, local_78.ex = local_88, NAN(b))) {
          local_78.ex = (a - (local_90 - local_88 * (-1.0 / b))) / (-1.0 / b - b);
          local_78.ey = b * local_78.ex + a;
        }
      }
      else if ((b != 0.0) || (local_78.ey = local_90, local_78.ex = a, NAN(b))) {
        local_78.ey = (a - (local_88 - local_90 * (-1.0 / b))) / (-1.0 / b - b);
        local_78.ex = b * local_78.ey + a;
      }
      iVar3 = (int)local_d0;
      local_78.a = a;
      local_78.b = b;
      local_78.invert = invert;
      local_78.sx = local_f8;
      local_78.sy = local_100;
      local_78.segmentNo = local_a4;
      local_78.firstPixelIndex = (int)local_a0 - (int)local_c8;
      local_78.len = iVar7;
      __position._M_current =
           (local_98->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_98->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<LineSegment,_std::allocator<LineSegment>_>::_M_realloc_insert<LineSegment>
                  (local_98,__position,&local_78);
      }
      else {
        pLVar5 = &local_78;
        for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
          (__position._M_current)->a = pLVar5->a;
          pLVar5 = (LineSegment *)((long)pLVar5 + ((ulong)bVar9 * -2 + 1) * 8);
          __position._M_current = __position._M_current + (ulong)bVar9 * -0x10 + 8;
        }
        ppLVar1 = &(local_98->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
LAB_00118f87:
      noPixels = iVar3 - count;
      x = x + count;
      y = y + count;
      iVar2 = count - iVar2;
      min_line_len = local_a8;
    } while (local_a8 <= noPixels);
  }
  return;
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo, vector<LineSegment> &lines, int min_line_len, double line_error)
{
	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				//linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}